

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::ReadProxy
          (JSONStringifier *this,JavascriptProxy *proxyObject,JSONObject *jsonObject,
          JSONObjectStack *stack)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  int iVar4;
  PropertyId propertyId;
  BOOL BVar5;
  JavascriptArray *this_00;
  undefined4 extraout_var;
  undefined4 *puVar6;
  JavascriptString *local_98;
  PropertyRecord *local_88;
  PropertyRecord *propertyRecord;
  PropertyDescriptor propertyDescriptor;
  JavascriptString *propertyName;
  Var element;
  uint32 i;
  uint32 resultLength;
  JavascriptArray *ownPropertyNames;
  JSONObjectStack *stack_local;
  JSONObject *jsonObject_local;
  JavascriptProxy *proxyObject_local;
  JSONStringifier *this_local;
  
  this_00 = Js::JavascriptProxy::PropertyKeysTrap
                      (proxyObject,GetOwnPropertyNamesKind,this->scriptContext);
  uVar3 = ArrayObject::GetLength(&this_00->super_ArrayObject);
  element._0_4_ = 0;
  do {
    if (uVar3 <= (uint)element) {
      return;
    }
    iVar4 = (*(this_00->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x72])(this_00,(ulong)(uint)element);
    bVar2 = VarIs<Js::JavascriptString>((Var)CONCAT44(extraout_var,iVar4));
    if (bVar2) {
      local_98 = UnsafeVarTo<Js::JavascriptString>((Var)CONCAT44(extraout_var,iVar4));
    }
    else {
      local_98 = (JavascriptString *)0x0;
    }
    propertyDescriptor._40_8_ = local_98;
    if (local_98 == (JavascriptString *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                  ,0x216,"(propertyName)","propertyName");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (propertyDescriptor._40_8_ != 0) {
      PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)&propertyRecord);
      JavascriptConversion::ToPropertyKey
                ((Var)propertyDescriptor._40_8_,this->scriptContext,&local_88,(PropertyString **)0x0
                );
      propertyId = PropertyRecord::GetPropertyId(local_88);
      BVar5 = Js::JavascriptOperators::GetOwnPropertyDescriptor
                        ((RecyclableObject *)proxyObject,propertyId,this->scriptContext,
                         (PropertyDescriptor *)&propertyRecord);
      if ((BVar5 != 0) &&
         (bVar2 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)&propertyRecord), bVar2)) {
        ReadObjectElement(this,(JavascriptString *)propertyDescriptor._40_8_,local_88,
                          (RecyclableObject *)proxyObject,jsonObject,stack);
      }
    }
    element._0_4_ = (uint)element + 1;
  } while( true );
}

Assistant:

void
JSONStringifier::ReadProxy(_In_ JavascriptProxy* proxyObject, _In_ JSONObject* jsonObject, _In_ JSONObjectStack* stack)
{
    JavascriptArray* ownPropertyNames = proxyObject->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertyNamesKind, this->scriptContext);

    // filter enumerable keys
    uint32 resultLength = ownPropertyNames->GetLength();
    for (uint32 i = 0; i < resultLength; i++)
    {
        Var element = ownPropertyNames->DirectGetItem(i);

        // Array should only have string elements, but let's check to be safe
        JavascriptString* propertyName = JavascriptOperators::TryFromVar<JavascriptString>(element);
        Assert(propertyName);
        if (propertyName != nullptr)
        {
            PropertyDescriptor propertyDescriptor;
            PropertyRecord const* propertyRecord;
            JavascriptConversion::ToPropertyKey(propertyName, scriptContext, &propertyRecord, nullptr);
            if (JavascriptOperators::GetOwnPropertyDescriptor(proxyObject, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
            {
                if (propertyDescriptor.IsEnumerable())
                {
                    this->ReadObjectElement(propertyName, propertyRecord, proxyObject, jsonObject, stack);
                }
            }
        }
    }
}